

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O1

QList<QGraphicsItem_*> * __thiscall
QGraphicsView::items
          (QList<QGraphicsItem_*> *__return_storage_ptr__,QGraphicsView *this,QRect *rect,
          ItemSelectionMode mode)

{
  long lVar1;
  long lVar2;
  QGraphicsScene *this_00;
  long in_FS_OFFSET;
  QPolygonF local_a0;
  QTransform local_88;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  lVar2 = *(long *)(lVar1 + 0x490);
  if (((lVar2 == 0) || (*(int *)(lVar2 + 4) == 0)) || (*(long *)(lVar1 + 0x498) == 0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_006417e6;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QGraphicsItem **)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    if ((lVar2 == 0) || (*(int *)(lVar2 + 4) == 0)) {
      this_00 = (QGraphicsScene *)0x0;
    }
    else {
      this_00 = *(QGraphicsScene **)(lVar1 + 0x498);
    }
    mapToScene(&local_a0,this,rect);
    viewportTransform(&local_88,this);
    QGraphicsScene::items(__return_storage_ptr__,this_00,&local_a0,mode,DescendingOrder,&local_88);
    if (&(local_a0.super_QList<QPointF>.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a0.super_QList<QPointF>.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>
      ._M_i = ((local_a0.super_QList<QPointF>.d.d)->super_QArrayData).ref_._q_value.
              super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_a0.super_QList<QPointF>.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_a0.super_QList<QPointF>.d.d)->super_QArrayData,0x10,0x10);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_006417e6:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QGraphicsItem *> QGraphicsView::items(const QRect &rect, Qt::ItemSelectionMode mode) const
{
    Q_D(const QGraphicsView);
    if (!d->scene)
        return QList<QGraphicsItem *>();
    return d->scene->items(mapToScene(rect), mode, Qt::DescendingOrder, viewportTransform());
}